

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator::GenerateBuilderMembers
          (ImmutableStringOneofFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  long lVar1;
  char *text;
  FieldDescriptor *field;
  
  field = (this->super_ImmutableStringFieldGenerator).descriptor_;
  if (*(int *)(*(long *)(field + 0x28) + 0x3c) != 3) {
    WriteFieldAccessorDocComment(printer,field,HAZZER,false);
    io::Printer::Print(printer,&(this->super_ImmutableStringFieldGenerator).variables_,
                       "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $has_oneof_case_message$;\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,"{","}",(this->super_ImmutableStringFieldGenerator).descriptor_);
    field = (this->super_ImmutableStringFieldGenerator).descriptor_;
  }
  WriteFieldAccessorDocComment(printer,field,GETTER,false);
  variables = &(this->super_ImmutableStringFieldGenerator).variables_;
  io::Printer::Print(printer,variables,
                     "$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n  java.lang.Object ref $default_init$;\n  if ($has_oneof_case_message$) {\n    ref = $oneof_name$_;\n  }\n  if (!(ref instanceof java.lang.String)) {\n    com.google.protobuf.ByteString bs =\n        (com.google.protobuf.ByteString) ref;\n    java.lang.String s = bs.toStringUtf8();\n    if ($has_oneof_case_message$) {\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableStringFieldGenerator).descriptor_);
  lVar1 = *(long *)((this->super_ImmutableStringFieldGenerator).descriptor_ + 0x28);
  if (*(int *)(lVar1 + 0x3c) == 3) {
    text = "      $oneof_name$_ = s;\n";
  }
  else {
    text = "      if (bs.isValidUtf8()) {\n        $oneof_name$_ = s;\n      }\n";
    if (*(char *)(*(long *)(lVar1 + 0x88) + 0x9a) != '\0') {
      text = "      $oneof_name$_ = s;\n";
    }
  }
  io::Printer::Print(printer,variables,text);
  io::Printer::Print(printer,variables,
                     "    }\n    return s;\n  } else {\n    return (java.lang.String) ref;\n  }\n}\n"
                    );
  WriteFieldStringBytesAccessorDocComment
            (printer,(this->super_ImmutableStringFieldGenerator).descriptor_,GETTER,false);
  io::Printer::Print(printer,variables,
                     "$deprecation$public com.google.protobuf.ByteString\n    ${$get$capitalized_name$Bytes$}$() {\n  java.lang.Object ref $default_init$;\n  if ($has_oneof_case_message$) {\n    ref = $oneof_name$_;\n  }\n  if (ref instanceof String) {\n    com.google.protobuf.ByteString b = \n        com.google.protobuf.ByteString.copyFromUtf8(\n            (java.lang.String) ref);\n    if ($has_oneof_case_message$) {\n      $oneof_name$_ = b;\n    }\n    return b;\n  } else {\n    return (com.google.protobuf.ByteString) ref;\n  }\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableStringFieldGenerator).descriptor_);
  WriteFieldAccessorDocComment
            (printer,(this->super_ImmutableStringFieldGenerator).descriptor_,SETTER,true);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder ${$set$capitalized_name$$}$(\n    java.lang.String value) {\n$null_check$  $set_oneof_case_message$;\n  $oneof_name$_ = value;\n  $on_changed$\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableStringFieldGenerator).descriptor_);
  WriteFieldAccessorDocComment
            (printer,(this->super_ImmutableStringFieldGenerator).descriptor_,CLEARER,true);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  if ($has_oneof_case_message$) {\n    $clear_oneof_case_message$;\n    $oneof_name$_ = null;\n    $on_changed$\n  }\n  return this;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableStringFieldGenerator).descriptor_);
  WriteFieldStringBytesAccessorDocComment
            (printer,(this->super_ImmutableStringFieldGenerator).descriptor_,SETTER,true);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder ${$set$capitalized_name$Bytes$}$(\n    com.google.protobuf.ByteString value) {\n$null_check$"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"{","}",(this->super_ImmutableStringFieldGenerator).descriptor_);
  lVar1 = *(long *)((this->super_ImmutableStringFieldGenerator).descriptor_ + 0x28);
  if ((*(int *)(lVar1 + 0x3c) == 3) || (*(char *)(*(long *)(lVar1 + 0x88) + 0x9a) == '\x01')) {
    io::Printer::Print(printer,variables,"  checkByteStringIsUtf8(value);\n");
  }
  io::Printer::Print(printer,variables,
                     "  $set_oneof_case_message$;\n  $oneof_name$_ = value;\n  $on_changed$\n  return this;\n}\n"
                    );
  return;
}

Assistant:

void ImmutableStringOneofFieldGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER);
    printer->Print(
        variables_,
        "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
        "  return $has_oneof_case_message$;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(
      variables_,
      "$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n"
      "  java.lang.Object ref $default_init$;\n"
      "  if ($has_oneof_case_message$) {\n"
      "    ref = $oneof_name$_;\n"
      "  }\n"
      "  if (!(ref instanceof java.lang.String)) {\n"
      "    com.google.protobuf.ByteString bs =\n"
      "        (com.google.protobuf.ByteString) ref;\n"
      "    java.lang.String s = bs.toStringUtf8();\n"
      "    if ($has_oneof_case_message$) {\n");
  printer->Annotate("{", "}", descriptor_);
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_, "      $oneof_name$_ = s;\n");
  } else {
    printer->Print(variables_,
                   "      if (bs.isValidUtf8()) {\n"
                   "        $oneof_name$_ = s;\n"
                   "      }\n");
  }
  printer->Print(variables_,
                 "    }\n"
                 "    return s;\n"
                 "  } else {\n"
                 "    return (java.lang.String) ref;\n"
                 "  }\n"
                 "}\n");

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, GETTER);
  printer->Print(variables_,
                 "$deprecation$public com.google.protobuf.ByteString\n"
                 "    ${$get$capitalized_name$Bytes$}$() {\n"
                 "  java.lang.Object ref $default_init$;\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    ref = $oneof_name$_;\n"
                 "  }\n"
                 "  if (ref instanceof String) {\n"
                 "    com.google.protobuf.ByteString b = \n"
                 "        com.google.protobuf.ByteString.copyFromUtf8(\n"
                 "            (java.lang.String) ref);\n"
                 "    if ($has_oneof_case_message$) {\n"
                 "      $oneof_name$_ = b;\n"
                 "    }\n"
                 "    return b;\n"
                 "  } else {\n"
                 "    return (com.google.protobuf.ByteString) ref;\n"
                 "  }\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
                 "    java.lang.String value) {\n"
                 "$null_check$"
                 "  $set_oneof_case_message$;\n"
                 "  $oneof_name$_ = value;\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  if ($has_oneof_case_message$) {\n"
      "    $clear_oneof_case_message$;\n"
      "    $oneof_name$_ = null;\n"
      "    $on_changed$\n"
      "  }\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, SETTER,
                                          /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$set$capitalized_name$Bytes$}$(\n"
      "    com.google.protobuf.ByteString value) {\n"
      "$null_check$");
  printer->Annotate("{", "}", descriptor_);
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_, "  checkByteStringIsUtf8(value);\n");
  }
  printer->Print(variables_,
                 "  $set_oneof_case_message$;\n"
                 "  $oneof_name$_ = value;\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
}